

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O1

int scope_stack_pop(scope sp)

{
  int iVar1;
  size_t *psVar2;
  size_t line;
  char *message;
  
  if (sp == (scope)0x0) {
    message = "Scope stack pop invalid parameters";
    line = 0x24e;
  }
  else {
    psVar2 = scope_stack_return(sp);
    iVar1 = vector_resize(sp->call_stack,*psVar2);
    if (iVar1 == 0) {
      return 0;
    }
    message = "Scope bad call stack size decrease";
    line = 0x246;
  }
  log_write_impl_va("metacall",line,"scope_stack_pop",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                    ,LOG_LEVEL_ERROR,message);
  return 1;
}

Assistant:

int scope_stack_pop(scope sp)
{
	if (sp != NULL)
	{
		scope_stack_ptr *return_ptr = scope_stack_return(sp);

		if (vector_resize(sp->call_stack, *return_ptr) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Scope bad call stack size decrease");

			return 1;
		}

		return 0;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Scope stack pop invalid parameters");

	return 1;
}